

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

void __thiscall QGroupBox::QGroupBox(QGroupBox *this,QWidget *parent)

{
  QGroupBoxPrivate *this_00;
  
  this_00 = (QGroupBoxPrivate *)operator_new(0x288);
  QGroupBoxPrivate::QGroupBoxPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007cd250;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QGroupBox_007cd408;
  QGroupBoxPrivate::init
            (*(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QGroupBox::QGroupBox(QWidget *parent)
    : QWidget(*new QGroupBoxPrivate, parent, { })
{
    Q_D(QGroupBox);
    d->init();
}